

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adynarray.c
# Opt level: O2

void * private_ACUtils_ADynArray_construct(size_t typeSize)

{
  void *pvVar1;
  
  pvVar1 = private_ACUtils_ADynArray_constructWithAllocator(typeSize,realloc,free);
  return pvVar1;
}

Assistant:

ACUTILS_HD_FUNC void* private_ACUtils_ADynArray_construct(size_t typeSize)
{
    return private_ACUtils_ADynArray_constructWithAllocator(typeSize, realloc, free);
}